

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O0

int detect_retinaface(Mat *bgr,vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects)

{
  __normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_> __last;
  __normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_> __last_00;
  __normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_> __last_01;
  float *pfVar1;
  vector<FaceObject,_std::allocator<FaceObject>_> *faceobjects_00;
  vector<int,_std::allocator<int>_> *picked_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_RSI;
  long in_RDI;
  float y1;
  float x1;
  float y0;
  float x0;
  int i;
  int face_count;
  vector<int,_std::allocator<int>_> picked;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects8;
  Mat anchors_2;
  Mat scales_2;
  Mat ratios_2;
  int feat_stride_2;
  int base_size_2;
  Mat landmark_blob_2;
  Mat bbox_blob_2;
  Mat score_blob_2;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects16;
  Mat anchors_1;
  Mat scales_1;
  Mat ratios_1;
  int feat_stride_1;
  int base_size_1;
  Mat landmark_blob_1;
  Mat bbox_blob_1;
  Mat score_blob_1;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  Mat anchors;
  Mat scales;
  Mat ratios;
  int feat_stride;
  int base_size;
  Mat landmark_blob;
  Mat bbox_blob;
  Mat score_blob;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  Extractor ex;
  Mat in;
  int img_h;
  int img_w;
  float nms_threshold;
  float prob_threshold;
  Net retinaface;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_stack_fffffffffffff7b8;
  float in_stack_fffffffffffff7c0;
  float in_stack_fffffffffffff7c4;
  float in_stack_fffffffffffff7c8;
  float in_stack_fffffffffffff7cc;
  Mat *in_stack_fffffffffffff7d0;
  Net *in_stack_fffffffffffff7d8;
  Net *in_stack_fffffffffffff7e0;
  Mat *in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  Extractor *in_stack_fffffffffffff7f8;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  float fVar5;
  undefined4 in_stack_fffffffffffff80c;
  __normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
  in_stack_fffffffffffff810;
  const_iterator in_stack_fffffffffffff818;
  Mat *in_stack_fffffffffffff838;
  Mat *in_stack_fffffffffffff840;
  undefined8 in_stack_fffffffffffff848;
  int base_size_00;
  float local_728;
  float local_724;
  float local_720;
  float local_71c;
  float local_718;
  float local_714;
  float local_710;
  float local_70c;
  float local_708;
  float local_704;
  float local_700;
  float local_6fc;
  int local_6f8;
  int local_6f4;
  vector<int,_std::allocator<int>_> local_6f0;
  FaceObject *local_6d8;
  FaceObject *local_6d0;
  FaceObject *local_6c8;
  FaceObject *local_6c0;
  undefined1 local_6b0 [96];
  Mat local_650;
  Mat local_608;
  undefined4 local_5c0;
  undefined4 local_5bc;
  Mat local_5b8;
  Mat local_570;
  Mat local_528;
  FaceObject *local_4e0;
  FaceObject *local_4d8;
  FaceObject *local_4d0;
  FaceObject *local_4c8;
  Mat local_458;
  Mat local_410;
  undefined4 local_3c8;
  undefined4 local_3c4;
  Mat local_3c0;
  Mat local_378;
  Mat local_330;
  FaceObject *local_2e8;
  FaceObject *local_2e0;
  FaceObject *local_2d8;
  FaceObject *local_2d0;
  Mat local_260;
  Mat local_218;
  undefined4 local_1d0;
  undefined4 local_1cc;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe4c;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  Mat *in_stack_fffffffffffffe70;
  Mat local_180;
  Mat local_138;
  vector<FaceObject,_std::allocator<FaceObject>_> local_f0 [4];
  int local_7c;
  int local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined1 local_39;
  vector<FaceObject,_std::allocator<FaceObject>_> *local_10;
  long local_8;
  
  base_size_00 = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  ncnn::Net::Net(in_stack_fffffffffffff7e0);
  local_39 = 1;
  ncnn::Net::load_param(in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0);
  ncnn::Net::load_model(in_stack_fffffffffffff7d8,(char *)in_stack_fffffffffffff7d0);
  local_70 = 0x3f4ccccd;
  local_74 = 0x3ecccccd;
  local_78 = *(int *)(local_8 + 0xc);
  local_7c = *(int *)(local_8 + 8);
  ncnn::Mat::from_pixels
            ((uchar *)in_stack_fffffffffffff7e8,(int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
             (int)in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
             (Allocator *)in_stack_fffffffffffff7d0);
  ncnn::Net::create_extractor((Net *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
  ncnn::Extractor::input
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)0x142a60);
  ncnn::Mat::Mat(&local_138);
  ncnn::Mat::Mat(&local_180);
  ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffe38);
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  local_1cc = 0x10;
  local_1d0 = 0x20;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  pfVar1 = ncnn::Mat::operator[](&local_218,0);
  *pfVar1 = 1.0;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  pfVar1 = ncnn::Mat::operator[](&local_260,0);
  *pfVar1 = 32.0;
  pfVar1 = ncnn::Mat::operator[](&local_260,1);
  *pfVar1 = 16.0;
  generate_anchors(base_size_00,in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)0x142bf2);
  generate_proposals(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     in_stack_fffffffffffffe40);
  local_2d0 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __gnu_cxx::__normal_iterator<FaceObject_const*,std::vector<FaceObject,std::allocator<FaceObject>>>
  ::__normal_iterator<FaceObject*>
            ((__normal_iterator<const_FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
             (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)in_stack_fffffffffffff7b8);
  local_2d8 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::begin(in_stack_fffffffffffff7b8)
  ;
  local_2e0 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __last._M_current._4_4_ = in_stack_fffffffffffff80c;
  __last._M_current._0_4_ = in_stack_fffffffffffff808;
  local_2e8 = (FaceObject *)
              std::vector<FaceObject,std::allocator<FaceObject>>::
              insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                        (in_stack_fffffffffffff800,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff810,__last);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::~vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)in_stack_fffffffffffff7d0);
  ncnn::Mat::~Mat((Mat *)0x142ceb);
  ncnn::Mat::~Mat((Mat *)0x142cf8);
  ncnn::Mat::~Mat((Mat *)0x142d05);
  ncnn::Mat::~Mat((Mat *)0x142d12);
  ncnn::Mat::~Mat((Mat *)0x142d1f);
  ncnn::Mat::~Mat((Mat *)0x142d2c);
  ncnn::Mat::Mat(&local_330);
  ncnn::Mat::Mat(&local_378);
  ncnn::Mat::Mat(&local_3c0);
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  local_3c4 = 0x10;
  local_3c8 = 0x10;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  pfVar1 = ncnn::Mat::operator[](&local_410,0);
  *pfVar1 = 1.0;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  pfVar1 = ncnn::Mat::operator[](&local_458,0);
  *pfVar1 = 8.0;
  pfVar1 = ncnn::Mat::operator[](&local_458,1);
  *pfVar1 = 4.0;
  generate_anchors(base_size_00,in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)0x142ebe);
  generate_proposals(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     in_stack_fffffffffffffe40);
  local_4c8 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __gnu_cxx::__normal_iterator<FaceObject_const*,std::vector<FaceObject,std::allocator<FaceObject>>>
  ::__normal_iterator<FaceObject*>
            ((__normal_iterator<const_FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
             (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)in_stack_fffffffffffff7b8);
  local_4d0 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::begin(in_stack_fffffffffffff7b8)
  ;
  local_4d8 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __last_00._M_current._4_4_ = in_stack_fffffffffffff80c;
  __last_00._M_current._0_4_ = in_stack_fffffffffffff808;
  local_4e0 = (FaceObject *)
              std::vector<FaceObject,std::allocator<FaceObject>>::
              insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                        (in_stack_fffffffffffff800,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff810,__last_00);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::~vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)in_stack_fffffffffffff7d0);
  ncnn::Mat::~Mat((Mat *)0x142fb7);
  ncnn::Mat::~Mat((Mat *)0x142fc4);
  ncnn::Mat::~Mat((Mat *)0x142fd1);
  ncnn::Mat::~Mat((Mat *)0x142fde);
  ncnn::Mat::~Mat((Mat *)0x142feb);
  ncnn::Mat::~Mat((Mat *)0x142ff8);
  ncnn::Mat::Mat(&local_528);
  ncnn::Mat::Mat(&local_570);
  ncnn::Mat::Mat(&local_5b8);
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  ncnn::Extractor::extract
            (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
             (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20));
  local_5bc = 0x10;
  local_5c0 = 8;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  pfVar1 = ncnn::Mat::operator[](&local_608,0);
  *pfVar1 = 1.0;
  ncnn::Mat::Mat(in_stack_fffffffffffff7d0,(int)in_stack_fffffffffffff7cc,
                 CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
                 (Allocator *)in_stack_fffffffffffff7b8);
  faceobjects_00 =
       (vector<FaceObject,_std::allocator<FaceObject>_> *)ncnn::Mat::operator[](&local_650,0);
  *(float *)&(faceobjects_00->super__Vector_base<FaceObject,_std::allocator<FaceObject>_>)._M_impl.
             super__Vector_impl_data._M_start = 2.0;
  picked_00 = (vector<int,_std::allocator<int>_> *)ncnn::Mat::operator[](&local_650,1);
  *(float *)&(picked_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start = 1.0;
  generate_anchors((int)((ulong)picked_00 >> 0x20),in_stack_fffffffffffff840,
                   in_stack_fffffffffffff838);
  fVar5 = (float)((ulong)local_6b0 >> 0x20);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)0x14318a);
  generate_proposals(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                     in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     in_stack_fffffffffffffe40);
  local_6c0 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __gnu_cxx::__normal_iterator<FaceObject_const*,std::vector<FaceObject,std::allocator<FaceObject>>>
  ::__normal_iterator<FaceObject*>
            ((__normal_iterator<const_FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0),
             (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
              *)in_stack_fffffffffffff7b8);
  local_6c8 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::begin(in_stack_fffffffffffff7b8)
  ;
  local_6d0 = (FaceObject *)
              std::vector<FaceObject,_std::allocator<FaceObject>_>::end(in_stack_fffffffffffff7b8);
  __last_01._M_current._4_4_ = in_stack_fffffffffffff80c;
  __last_01._M_current._0_4_ = in_stack_fffffffffffff808;
  local_6d8 = (FaceObject *)
              std::vector<FaceObject,std::allocator<FaceObject>>::
              insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                        (in_stack_fffffffffffff800,in_stack_fffffffffffff818,
                         in_stack_fffffffffffff810,__last_01);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::~vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)in_stack_fffffffffffff7d0);
  ncnn::Mat::~Mat((Mat *)0x143277);
  ncnn::Mat::~Mat((Mat *)0x143284);
  ncnn::Mat::~Mat((Mat *)0x143291);
  ncnn::Mat::~Mat((Mat *)0x14329e);
  ncnn::Mat::~Mat((Mat *)0x1432ab);
  ncnn::Mat::~Mat((Mat *)0x1432b8);
  qsort_descent_inplace
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)
             CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1432d9);
  nms_sorted_bboxes(faceobjects_00,picked_00,fVar5);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_6f0);
  local_6f4 = (int)sVar2;
  std::vector<FaceObject,_std::allocator<FaceObject>_>::resize
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)in_stack_fffffffffffff7e0,
             (size_type)in_stack_fffffffffffff7d8);
  for (local_6f8 = 0; local_6f8 < local_6f4; local_6f8 = local_6f8 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_6f0,(long)local_6f8);
    std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[](local_f0,(long)*pvVar3);
    std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[](local_10,(long)local_6f8);
    FaceObject::operator=
              ((FaceObject *)in_stack_fffffffffffff7d0,
               (FaceObject *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    local_6fc = (pvVar4->rect).x;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    local_700 = (pvVar4->rect).y;
    fVar5 = local_6fc;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    local_704 = fVar5 + (pvVar4->rect).width;
    fVar5 = local_700;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    local_708 = fVar5 + (pvVar4->rect).height;
    local_70c = (float)local_78 + -1.0;
    pfVar1 = std::min<float>(&local_6fc,&local_70c);
    local_710 = 0.0;
    pfVar1 = std::max<float>(pfVar1,&local_710);
    local_6fc = *pfVar1;
    local_714 = (float)local_7c + -1.0;
    pfVar1 = std::min<float>(&local_700,&local_714);
    local_718 = 0.0;
    pfVar1 = std::max<float>(pfVar1,&local_718);
    local_700 = *pfVar1;
    local_71c = (float)local_78 + -1.0;
    pfVar1 = std::min<float>(&local_704,&local_71c);
    local_720 = 0.0;
    pfVar1 = std::max<float>(pfVar1,&local_720);
    local_704 = *pfVar1;
    local_724 = (float)local_7c + -1.0;
    pfVar1 = std::min<float>(&local_708,&local_724);
    local_728 = 0.0;
    in_stack_fffffffffffff7d0 = (Mat *)std::max<float>(pfVar1,&local_728);
    local_708 = *(float *)&in_stack_fffffffffffff7d0->data;
    in_stack_fffffffffffff7c0 = local_6fc;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    (pvVar4->rect).x = in_stack_fffffffffffff7c0;
    in_stack_fffffffffffff7c4 = local_700;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    (pvVar4->rect).y = in_stack_fffffffffffff7c4;
    in_stack_fffffffffffff7c8 = local_704 - local_6fc;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    (pvVar4->rect).width = in_stack_fffffffffffff7c8;
    in_stack_fffffffffffff7cc = local_708 - local_700;
    pvVar4 = std::vector<FaceObject,_std::allocator<FaceObject>_>::operator[]
                       (local_10,(long)local_6f8);
    (pvVar4->rect).height = in_stack_fffffffffffff7cc;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7d0);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::~vector
            ((vector<FaceObject,_std::allocator<FaceObject>_> *)in_stack_fffffffffffff7d0);
  ncnn::Extractor::~Extractor
            ((Extractor *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  ncnn::Mat::~Mat((Mat *)0x143a5d);
  ncnn::Net::~Net((Net *)CONCAT44(in_stack_fffffffffffff7c4,in_stack_fffffffffffff7c0));
  return 0;
}

Assistant:

static int detect_retinaface(const cv::Mat& bgr, std::vector<FaceObject>& faceobjects)
{
    ncnn::Net retinaface;

    retinaface.opt.use_vulkan_compute = true;

    // model is converted from
    // https://github.com/deepinsight/insightface/tree/master/RetinaFace#retinaface-pretrained-models
    // https://github.com/deepinsight/insightface/issues/669
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    //     retinaface.load_param("retinaface-R50.param");
    //     retinaface.load_model("retinaface-R50.bin");
    retinaface.load_param("mnet.25-opt.param");
    retinaface.load_model("mnet.25-opt.bin");

    const float prob_threshold = 0.8f;
    const float nms_threshold = 0.4f;

    int img_w = bgr.cols;
    int img_h = bgr.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels(bgr.data, ncnn::Mat::PIXEL_BGR2RGB, img_w, img_h);

    ncnn::Extractor ex = retinaface.create_extractor();

    ex.input("data", in);

    std::vector<FaceObject> faceproposals;

    // stride 32
    {
        ncnn::Mat score_blob, bbox_blob, landmark_blob;
        ex.extract("face_rpn_cls_prob_reshape_stride32", score_blob);
        ex.extract("face_rpn_bbox_pred_stride32", bbox_blob);
        ex.extract("face_rpn_landmark_pred_stride32", landmark_blob);

        const int base_size = 16;
        const int feat_stride = 32;
        ncnn::Mat ratios(1);
        ratios[0] = 1.f;
        ncnn::Mat scales(2);
        scales[0] = 32.f;
        scales[1] = 16.f;
        ncnn::Mat anchors = generate_anchors(base_size, ratios, scales);

        std::vector<FaceObject> faceobjects32;
        generate_proposals(anchors, feat_stride, score_blob, bbox_blob, landmark_blob, prob_threshold, faceobjects32);

        faceproposals.insert(faceproposals.end(), faceobjects32.begin(), faceobjects32.end());
    }

    // stride 16
    {
        ncnn::Mat score_blob, bbox_blob, landmark_blob;
        ex.extract("face_rpn_cls_prob_reshape_stride16", score_blob);
        ex.extract("face_rpn_bbox_pred_stride16", bbox_blob);
        ex.extract("face_rpn_landmark_pred_stride16", landmark_blob);

        const int base_size = 16;
        const int feat_stride = 16;
        ncnn::Mat ratios(1);
        ratios[0] = 1.f;
        ncnn::Mat scales(2);
        scales[0] = 8.f;
        scales[1] = 4.f;
        ncnn::Mat anchors = generate_anchors(base_size, ratios, scales);

        std::vector<FaceObject> faceobjects16;
        generate_proposals(anchors, feat_stride, score_blob, bbox_blob, landmark_blob, prob_threshold, faceobjects16);

        faceproposals.insert(faceproposals.end(), faceobjects16.begin(), faceobjects16.end());
    }

    // stride 8
    {
        ncnn::Mat score_blob, bbox_blob, landmark_blob;
        ex.extract("face_rpn_cls_prob_reshape_stride8", score_blob);
        ex.extract("face_rpn_bbox_pred_stride8", bbox_blob);
        ex.extract("face_rpn_landmark_pred_stride8", landmark_blob);

        const int base_size = 16;
        const int feat_stride = 8;
        ncnn::Mat ratios(1);
        ratios[0] = 1.f;
        ncnn::Mat scales(2);
        scales[0] = 2.f;
        scales[1] = 1.f;
        ncnn::Mat anchors = generate_anchors(base_size, ratios, scales);

        std::vector<FaceObject> faceobjects8;
        generate_proposals(anchors, feat_stride, score_blob, bbox_blob, landmark_blob, prob_threshold, faceobjects8);

        faceproposals.insert(faceproposals.end(), faceobjects8.begin(), faceobjects8.end());
    }

    // sort all proposals by score from highest to lowest
    qsort_descent_inplace(faceproposals);

    // apply nms with nms_threshold
    std::vector<int> picked;
    nms_sorted_bboxes(faceproposals, picked, nms_threshold);

    int face_count = picked.size();

    faceobjects.resize(face_count);
    for (int i = 0; i < face_count; i++)
    {
        faceobjects[i] = faceproposals[picked[i]];

        // clip to image size
        float x0 = faceobjects[i].rect.x;
        float y0 = faceobjects[i].rect.y;
        float x1 = x0 + faceobjects[i].rect.width;
        float y1 = y0 + faceobjects[i].rect.height;

        x0 = std::max(std::min(x0, (float)img_w - 1), 0.f);
        y0 = std::max(std::min(y0, (float)img_h - 1), 0.f);
        x1 = std::max(std::min(x1, (float)img_w - 1), 0.f);
        y1 = std::max(std::min(y1, (float)img_h - 1), 0.f);

        faceobjects[i].rect.x = x0;
        faceobjects[i].rect.y = y0;
        faceobjects[i].rect.width = x1 - x0;
        faceobjects[i].rect.height = y1 - y0;
    }

    return 0;
}